

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

int __thiscall Catch::Session::run(Session *this)

{
  int iVar1;
  ostream *poVar2;
  
  if (((this->m_configData).waitForKeypress & BeforeStart) != Never) {
    poVar2 = std::operator<<((ostream *)&std::cout,"...waiting for enter/ return before starting");
    std::endl<char,std::char_traits<char>>(poVar2);
    getchar();
  }
  iVar1 = runInternal(this);
  if (((this->m_configData).waitForKeypress & BeforeExit) != Never) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "...waiting for enter/ return before exiting, with code: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
    getchar();
  }
  return iVar1;
}

Assistant:

int Session::run() {
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeStart ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before starting" << std::endl;
            static_cast<void>(std::getchar());
        }
        int exitCode = runInternal();
        if( ( m_configData.waitForKeypress & WaitForKeypress::BeforeExit ) != 0 ) {
            Catch::cout() << "...waiting for enter/ return before exiting, with code: " << exitCode << std::endl;
            static_cast<void>(std::getchar());
        }
        return exitCode;
    }